

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer pMVar9;
  size_type sVar10;
  bool bVar11;
  Colour colourGuard_3;
  Colour colourGuard_1;
  ConsoleAssertionPrinter printer;
  Colour colourGuard;
  char local_131;
  Column local_130;
  ostream *local_f8;
  AssertionStats *local_f0;
  AssertionStats *local_e8;
  Code local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98 [2];
  long local_88 [2];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_78;
  char local_60;
  string local_58;
  ConsoleReporter *local_38;
  
  iVar5 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  local_60 = '\x01';
  if (((char)iVar5 == '\0') &&
     (((OVar2 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar2 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (local_60 = '\0', OVar2 != Warning)))) {
    return false;
  }
  lazyPrint(this);
  local_f8 = (this->super_StreamingReporterBase).stream;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_e0 = None;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_98[0] = local_88;
  pcVar3 = (_assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_f0 = _assertionStats;
  local_e8 = _assertionStats;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,
             pcVar3 + (_assertionStats->assertionResult).m_resultData.message._M_string_length);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&local_78,&_assertionStats->infoMessages);
  OVar2 = (local_e8->assertionResult).m_resultData.resultType;
  if (ExpressionFailed < OVar2) {
    if (OVar2 < ThrewException) {
      if (OVar2 != ExplicitFailure) {
        if (OVar2 != Exception) goto LAB_00158096;
        goto switchD_00157d46_caseD_ffffffff;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_d8,0,local_d8._M_string_length,"FAILED",6);
      local_e0 = BrightRed;
      lVar6 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar6 == 0x48) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_b8,0,local_b8._M_string_length,"explicitly with message",0x17);
        lVar6 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      if ((ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_00158096;
      sVar10 = 0x18;
      pcVar8 = "explicitly with messages";
    }
    else {
      if (OVar2 == ThrewException) {
        local_e0 = BrightRed;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_d8,0,local_d8._M_string_length,"FAILED",6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_b8,0,local_b8._M_string_length,"due to unexpected exception with ",0x21);
        lVar6 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar6 == 0x48) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_b8,"message");
          lVar6 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        if (1 < (ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_b8,"messages");
        }
        goto LAB_00158096;
      }
      if (OVar2 == DidntThrowException) {
        local_e0 = BrightRed;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_d8,0,local_d8._M_string_length,"FAILED",6);
        sVar10 = 0x36;
        pcVar8 = "because no exception was thrown where one was expected";
      }
      else {
        if (OVar2 != FatalErrorCondition) goto LAB_00158096;
        local_e0 = BrightRed;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_d8,0,local_d8._M_string_length,"FAILED",6);
        sVar10 = 0x1e;
        pcVar8 = "due to a fatal error condition";
      }
    }
    goto LAB_00158084;
  }
  switch(OVar2) {
  case Ok:
    local_e0 = Green;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_d8,0,local_d8._M_string_length,"PASSED",6);
    lVar6 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar6 == 0x48) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_b8,0,local_b8._M_string_length,"with message",0xc);
LAB_00157e8f:
      lVar6 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
LAB_00157e9f:
    if ((ulong)((lVar6 >> 3) * -0x71c71c71c71c71c7) < 2) goto LAB_00158096;
    sVar10 = 0xd;
    pcVar8 = "with messages";
    break;
  case Info:
    sVar10 = 4;
    pcVar8 = "info";
    break;
  case Warning:
    sVar10 = 7;
    pcVar8 = "warning";
    break;
  case Unknown:
    goto switchD_00157d46_caseD_ffffffff;
  default:
    if (OVar2 != FailureBit) {
      if (OVar2 != ExpressionFailed) goto LAB_00158096;
      bVar11 = ((local_e8->assertionResult).m_info.resultDisposition & SuppressFail) == 0;
      local_e0 = Green;
      if (bVar11) {
        local_e0 = BrightRed;
      }
      pcVar8 = "FAILED - but was ok";
      if (bVar11) {
        pcVar8 = "FAILED";
      }
      sVar10 = 0x13;
      if (bVar11) {
        sVar10 = 6;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_d8,0,local_d8._M_string_length,pcVar8,sVar10);
      lVar6 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar6 == 0x48) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_b8,0,local_b8._M_string_length,"with message",0xc);
        goto LAB_00157e8f;
      }
      goto LAB_00157e9f;
    }
    goto switchD_00157d46_caseD_ffffffff;
  }
LAB_00158084:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_b8,0,local_b8._M_string_length,pcVar8,sVar10);
LAB_00158096:
  local_58._M_dataplus._M_p._0_1_ = 0;
  Colour::use(FileName);
  poVar7 = local_f8;
  local_130.m_string._M_dataplus._M_p = (local_e8->assertionResult).m_info.lineInfo.file;
  local_130.m_string._M_string_length = (local_e8->assertionResult).m_info.lineInfo.line;
  operator<<(local_f8,(SourceLineInfo *)&local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
  Colour::use(None);
  if ((local_f0->totals).assertions.failed + (local_f0->totals).assertions.passed +
      (local_f0->totals).assertions.failedButOk == 0) {
    local_130.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(local_f8,(char *)&local_130,1);
  }
  else {
    if (local_d8._M_string_length != 0) {
      local_130.m_string._M_dataplus._M_p =
           (pointer)((ulong)local_130.m_string._M_dataplus._M_p._1_7_ << 8);
      Colour::use(local_e0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f8,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n",2);
      Colour::use(None);
    }
    if ((local_e8->assertionResult).m_info.capturedExpression.m_size != 0) {
      local_58._M_dataplus._M_p._0_1_ = 0;
      Colour::use(Cyan);
      std::__ostream_insert<char,std::char_traits<char>>(local_f8,"  ",2);
      poVar7 = local_f8;
      AssertionResult::getExpressionInMacro_abi_cxx11_
                (&local_130.m_string,&local_e8->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,local_130.m_string._M_dataplus._M_p,local_130.m_string._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.m_string._M_dataplus._M_p != &local_130.m_string.field_2) {
        operator_delete(local_130.m_string._M_dataplus._M_p,
                        local_130.m_string.field_2._M_allocated_capacity + 1);
      }
      local_130.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(local_f8,(char *)&local_130,1);
      Colour::use(None);
    }
    bVar11 = AssertionResult::hasExpandedExpression(&local_e8->assertionResult);
    if (bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>(local_f8,"with expansion:\n",0x10);
      Colour::use(BrightYellow);
      poVar7 = local_f8;
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_58,&local_e8->assertionResult);
      paVar1 = &local_130.m_string.field_2;
      local_130.m_string._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,
                 CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                 local_58._M_string_length +
                 CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_));
      local_130.m_width = 0x4f;
      local_130.m_initialIndent = 0xffffffffffffffff;
      local_130.m_indent = 2;
      TextFlow::operator<<(poVar7,&local_130);
      local_131 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_131,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_130.m_string._M_dataplus._M_p,
                        local_130.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      Colour::use(None);
    }
  }
  if (local_b8._M_string_length != 0) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_f8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    local_130.m_string._M_dataplus._M_p._0_1_ = 0x3a;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_130,1);
    local_130.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_130,1);
  }
  local_38 = this;
  if (local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_130.m_string.field_2;
    pMVar9 = local_78.super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      poVar7 = local_f8;
      if ((local_60 != '\0') || (pMVar9->type != Info)) {
        pcVar3 = (pMVar9->message)._M_dataplus._M_p;
        local_130.m_string._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar3,pcVar3 + (pMVar9->message)._M_string_length);
        local_130.m_width = 0x4f;
        local_130.m_initialIndent = 0xffffffffffffffff;
        local_130.m_indent = 2;
        TextFlow::operator<<(poVar7,&local_130);
        local_58._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.m_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_130.m_string._M_dataplus._M_p,
                          local_130.m_string.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != local_78.
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  poVar7 = (local_38->super_StreamingReporterBase).stream;
  cVar4 = (char)poVar7;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&local_78);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return true;
switchD_00157d46_caseD_ffffffff:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_d8,0,local_d8._M_string_length,"** internal error **",0x14);
  local_e0 = BrightRed;
  goto LAB_00158096;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const &_assertionStats) {
                AssertionResult const &result = _assertionStats.assertionResult;

                bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

                // Drop out if result was successful but we're not printing them.
                if (!includeResults && result.getResultType() != ResultWas::Warning)
                    return false;

                lazyPrint();

                ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
                printer.print();
                stream << std::endl;
                return true;
            }